

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestreamout_array.hpp
# Opt level: O1

BOOL __thiscall ByteStreamOutArray::putByte(ByteStreamOutArray *this,U8 byte)

{
  ulong uVar1;
  U8 *pUVar2;
  
  if (this->curr == this->alloc) {
    uVar1 = this->alloc + 0x1000;
    this->alloc = uVar1;
    pUVar2 = (U8 *)realloc_las(this->data,uVar1 & 0xffffffff);
    this->data = pUVar2;
    if (pUVar2 == (U8 *)0x0) {
      return false;
    }
  }
  this->data[this->curr] = byte;
  if (this->curr == this->size) {
    this->size = this->size + 1;
  }
  this->curr = this->curr + 1;
  return true;
}

Assistant:

inline BOOL ByteStreamOutArray::putByte(U8 byte)
{
  if (curr == alloc)
  {
    alloc += 4096;
    data = (U8*)realloc_las(data, (U32)alloc);
    if (data == 0)
    {
      return FALSE;
    }
  }
  data[curr] = byte;
  if (curr == size) size++;
  curr++;
  return TRUE;
}